

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::InnerMap::TreeConvert(InnerMap *this,size_type b)

{
  _Rb_tree_header *p_Var1;
  void **ppvVar2;
  void *pvVar3;
  LogMessage *pLVar4;
  pointer tree;
  size_type sVar5;
  size_type sVar6;
  _Node_allocator local_80;
  undefined1 local_70 [40];
  MapAllocator<std::set<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_google::protobuf::internal::DerefCompare<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_google::protobuf::internal::MapAllocator<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>_>
  local_48;
  other tree_allocator;
  LogFinisher local_31;
  
  ppvVar2 = this->table_;
  pvVar3 = ppvVar2[b];
  if (((pvVar3 != (void *)0x0) && (pvVar3 == ppvVar2[b ^ 1])) ||
     (ppvVar2[b ^ 1] == pvVar3 && ppvVar2[b ^ 1] != (void *)0x0)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/map.h"
               ,0x379);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_80,
                        "CHECK failed: !TableEntryIsTree(b) && !TableEntryIsTree(b ^ 1): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_48,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)&local_80);
  }
  local_48.arena_ = (this->alloc_).arena_;
  tree = internal::
         MapAllocator<std::set<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_google::protobuf::internal::DerefCompare<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_google::protobuf::internal::MapAllocator<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>_>
         ::allocate(&local_48,1,(void *)0x0);
  local_80.arena_ = (this->alloc_).arena_;
  local_70._16_8_ = local_70;
  local_70._0_4_ = _S_red;
  local_70._32_8_ = 0;
  (tree->_M_t)._M_impl.super__Node_allocator.arena_ = local_80.arena_;
  p_Var1 = &(tree->_M_t)._M_impl.super__Rb_tree_header;
  (tree->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (tree->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (tree->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (tree->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_70._8_8_ = (pointer)0x0;
  (tree->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._24_8_ = local_70._16_8_;
  std::
  _Rb_tree<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::_Identity<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_google::protobuf::internal::DerefCompare<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_google::protobuf::internal::MapAllocator<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  ::~_Rb_tree((_Rb_tree<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::_Identity<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_google::protobuf::internal::DerefCompare<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_google::protobuf::internal::MapAllocator<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
               *)&local_80);
  sVar5 = CopyListToTree(this,b,tree);
  tree_allocator.arena_ = (Arena *)b;
  sVar6 = CopyListToTree(this,b ^ 1,tree);
  if (sVar6 + sVar5 != (tree->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/map.h"
               ,900);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_80,"CHECK failed: (count) == (tree->size()): ");
    internal::LogFinisher::operator=(&local_31,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)&local_80);
  }
  this->table_[b ^ 1] = tree;
  this->table_[(long)tree_allocator.arena_] = tree;
  return;
}

Assistant:

void TreeConvert(size_type b) {
      GOOGLE_DCHECK(!TableEntryIsTree(b) && !TableEntryIsTree(b ^ 1));
      typename Allocator::template rebind<Tree>::other tree_allocator(alloc_);
      Tree* tree = tree_allocator.allocate(1);
      // We want to use the three-arg form of construct, if it exists, but we
      // create a temporary and use the two-arg construct that's known to exist.
      // It's clunky, but the compiler should be able to generate more-or-less
      // the same code.
      tree_allocator.construct(
          tree, Tree(typename Tree::key_compare(), KeyPtrAllocator(alloc_)));
      // Now the tree is ready to use.
      size_type count = CopyListToTree(b, tree) + CopyListToTree(b ^ 1, tree);
      GOOGLE_DCHECK_EQ(count, tree->size());
      table_[b] = table_[b ^ 1] = static_cast<void*>(tree);
    }